

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void * stack_push_internal(AbstractStack *s,void *elem)

{
  size_t __size;
  void **__src;
  void **__dest;
  ulong uVar1;
  ulong uVar2;
  
  __src = s->start;
  uVar2 = (long)s->cur - (long)__src;
  uVar1 = (long)(int)(uVar2 >> 2) & 0xfffffffffffffffe;
  __size = uVar1 * 8;
  if (__src == s->initial) {
    __dest = (void **)malloc(__size);
    s->cur = __dest;
    memcpy(__dest,__src,(long)(uVar2 * 0x20000000) >> 0x1d & 0xfffffffffffffff8);
  }
  else {
    __dest = (void **)realloc(__src,__size);
  }
  s->start = __dest;
  s->end = __dest + uVar1;
  s->cur = __dest + ((long)(uVar2 * 0x20000000) >> 0x20) + 1;
  __dest[(long)(uVar2 * 0x20000000) >> 0x20] = elem;
  return elem;
}

Assistant:

void *stack_push_internal(AbstractStack *s, void *elem) {
  int n = s->cur - s->start;
  if (s->start == s->initial) {
    s->cur = (void **)MALLOC(n * 2 * sizeof(void *));
    memcpy(s->cur, s->start, n * sizeof(void *));
  } else
    s->cur = (void **)REALLOC(s->start, n * 2 * sizeof(void *));
  s->end = s->start = s->cur;
  s->cur += n;
  s->end += n * 2;
  *s->cur++ = elem;
  return elem;
}